

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O3

void jpeg_idct_2x2(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  JSAMPROW pJVar5;
  bool bVar6;
  short sVar7;
  int *piVar8;
  bool bVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  JSAMPLE JVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int local_68 [10];
  int workspace [16];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  lVar10 = 0;
  uVar11 = 9;
  do {
    uVar12 = uVar11 - 1;
    if ((uVar11 != 3) && ((uVar12 & 0x7ffffffd) != 4)) {
      sVar1 = *(short *)((long)coef_block + lVar10 + 0x10);
      sVar7 = *(short *)((long)coef_block + lVar10 + 0x30);
      if (sVar7 == 0 && sVar1 == 0) {
        if ((*(short *)((long)coef_block + lVar10 + 0x50) != 0) ||
           (*(short *)((long)coef_block + lVar10 + 0x70) != 0)) {
          sVar7 = 0;
          goto LAB_0014ba78;
        }
        iVar15 = (int)*(short *)((long)pvVar4 + lVar10) * (int)*(short *)((long)coef_block + lVar10)
                 * 4;
        *(int *)((long)local_68 + lVar10 * 2) = iVar15;
      }
      else {
LAB_0014ba78:
        uVar16 = (long)*(short *)((long)pvVar4 + lVar10) *
                 (long)*(short *)((long)coef_block + lVar10) * 0x8000;
        lVar14 = (long)sVar1 * (long)*(short *)((long)pvVar4 + lVar10 + 0x10) * 0x73fc +
                 (long)*(short *)((long)pvVar4 + lVar10 + 0x30) * (long)sVar7 * -0x28ba +
                 (long)*(short *)((long)pvVar4 + lVar10 + 0x50) *
                 (long)*(short *)((long)coef_block + lVar10 + 0x50) * 0x1b37 +
                 (long)*(short *)((long)pvVar4 + lVar10 + 0x70) *
                 (long)*(short *)((long)coef_block + lVar10 + 0x70) * -0x1712;
        *(int *)((long)local_68 + lVar10 * 2) = (int)(uVar16 + lVar14 + 0x1000 >> 0xd);
        iVar15 = (int)((uVar16 | 0x1000) - lVar14 >> 0xd);
      }
      *(int *)((long)workspace + lVar10 * 2 + -8) = iVar15;
    }
    lVar10 = lVar10 + 2;
    uVar11 = uVar12;
    if (uVar12 < 2) {
      uVar16 = (ulong)output_col;
      piVar8 = local_68 + 7;
      lVar10 = 0;
      bVar6 = true;
      do {
        bVar9 = bVar6;
        pJVar5 = output_buf[lVar10];
        iVar15 = piVar8[-4];
        if (((iVar15 == 0 && piVar8[-6] == 0) && (iVar15 = 0, piVar8[-2] == 0)) && (*piVar8 == 0)) {
          JVar13 = pJVar3[(ulong)(piVar8[-7] + 0x10U >> 5 & 0x3ff) + 0x80];
          pJVar5[uVar16] = JVar13;
        }
        else {
          iVar2 = piVar8[-7];
          iVar15 = piVar8[-6] * 0x73fc + *piVar8 * -0x1712 + iVar15 * -0x28ba + piVar8[-2] * 0x1b37;
          pJVar5[uVar16] =
               pJVar3[(ulong)(iVar2 * 0x8000 + iVar15 + 0x80000U >> 0x14 & 0x3ff) + 0x80];
          JVar13 = pJVar3[(ulong)((uint)((iVar2 * 0x8000 + 0x80000) - iVar15) >> 0x14 & 0x3ff) +
                          0x80];
        }
        pJVar5[uVar16 + 1] = JVar13;
        piVar8 = piVar8 + 8;
        lVar10 = 1;
        bVar6 = false;
      } while (bVar9);
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_2x2(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp10, z1;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 2];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process columns 2,4,6 */
    if (ctr == DCTSIZE - 2 || ctr == DCTSIZE - 4 || ctr == DCTSIZE - 6)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 3] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine terms 2,4,6 for 2x2 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;

      continue;
    }

    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(z1, CONST_BITS + 2);

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp0 = MULTIPLY(z1, -FIX_0_720959822);  /* sqrt(2) * ( c7-c5+c3-c1) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp0 += MULTIPLY(z1, FIX_0_850430095);  /* sqrt(2) * (-c1+c3+c5+c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp0 += MULTIPLY(z1, -FIX_1_272758580); /* sqrt(2) * (-c1+c3-c5-c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 += MULTIPLY(z1, FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp0, CONST_BITS - PASS1_BITS + 2);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp10 - tmp0, CONST_BITS - PASS1_BITS + 2);
  }

  /* Pass 2: process 2 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 2; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[3] == 0 && wsptr[5] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 2);

    /* Odd part */

    tmp0 = MULTIPLY((JLONG)wsptr[7], -FIX_0_720959822) + /* sqrt(2) * ( c7-c5+c3-c1) */
           MULTIPLY((JLONG)wsptr[5],  FIX_0_850430095) + /* sqrt(2) * (-c1+c3+c5+c7) */
           MULTIPLY((JLONG)wsptr[3], -FIX_1_272758580) + /* sqrt(2) * (-c1+c3-c5-c7) */
           MULTIPLY((JLONG)wsptr[1],  FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp10 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}